

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_cmd.c
# Opt level: O1

int cfg_cmd_handle_schema(cfg_db *db,char *arg,autobuf *log)

{
  avl_node *paVar1;
  cfg_schema *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  avl_node *paVar6;
  size_t sVar7;
  avl_node *paVar8;
  char *pcVar9;
  avl_node *paVar10;
  list_entity *plVar11;
  list_entity *plVar12;
  avl_node *paVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  char *local_40;
  char *local_38;
  
  pcVar2 = db->schema;
  if (pcVar2 == (cfg_schema *)0x0) {
    abuf_puts(log,"Internal error, database not connected to schema\n");
    iVar3 = -1;
  }
  else {
    if ((arg == (char *)0x0) || (*arg == '\0')) {
      abuf_puts(log,
                "List of section types:\n(use this command with the types as parameter for more information)\n"
               );
      plVar12 = (db->schema->sections).list_head.next;
      if (plVar12->prev != (db->schema->sections).list_head.prev) {
        do {
          if (*(char *)((long)&plVar12[3].next + 1) == '\0') {
            plVar11 = plVar12[5].next;
            pcVar4 = ": ";
            if (plVar11 == (list_entity *)0x0) {
              pcVar4 = "";
              plVar11 = (list_entity *)0x13e44a;
            }
            cfg_append_printable_line
                      (log,"    %s (%s)%s%s",plVar12[3].prev,
                       CFG_SCHEMA_SECTIONMODE[*(uint *)&plVar12[4].prev],pcVar4,plVar11);
          }
          else if (plVar12[5].next != (list_entity *)0x0) {
            cfg_append_printable_line(log,"        %s");
          }
          plVar12 = plVar12->next;
        } while (plVar12->prev != (db->schema->sections).list_head.prev);
      }
    }
    else {
      iVar3 = strcmp(arg,"all");
      if (iVar3 != 0) {
        pcVar4 = strdup(arg);
        pcVar5 = strchr(pcVar4,0x2e);
        if (pcVar5 == (char *)0x0) {
          pcVar9 = (char *)0x0;
        }
        else {
          pcVar9 = pcVar5 + 1;
          *pcVar5 = '\0';
        }
        if (pcVar9 == (char *)0x0) {
          iVar3 = _print_schema_section(log,db,pcVar4);
        }
        else {
          local_40 = pcVar4;
          local_38 = pcVar9;
          paVar6 = avl_find(&db->schema->entries,&local_40);
          if (paVar6 != (avl_node *)0x0) {
            paVar10 = (avl_node *)0x0;
            paVar8 = paVar6;
            do {
              if (paVar8 == (avl_node *)&db->schema->entries) break;
              if (paVar8 == paVar6) {
                pcVar9 = "";
                pcVar5 = "";
                if (paVar8[1].left == (avl_node *)0x0) {
                  pcVar5 = " (mandatory)";
                }
                if (paVar8[1].balance != '\0') {
                  pcVar9 = " (list)";
                }
                cfg_append_printable_line(log,"    %s%s%s",paVar8[1].parent,pcVar5,pcVar9);
                if (paVar8[1].left != (avl_node *)0x0) {
                  cfg_append_printable_line(log,"    Default value:");
                  paVar13 = paVar8[1].left;
                  if (paVar13 != (avl_node *)0x0) {
                    for (; paVar13 < (avl_node *)
                                     ((long)&((paVar8[1].right)->list).next +
                                     (long)&((paVar8[1].left)->list).next);
                        paVar13 = (avl_node *)((long)&(paVar13->list).next + sVar7 + 1)) {
                      cfg_append_printable_line(log,"        \'%s\'",paVar13);
                      sVar7 = strlen((char *)paVar13);
                    }
                  }
                }
              }
              else if (paVar8->follower == false) break;
              plVar12 = paVar8[2].list.prev;
              if (plVar12 != (list_entity *)0x0) {
                if ((paVar10 != (avl_node *)0x0) && (paVar10[2].list.prev == plVar12)) {
                  auVar14[0] = -(*(char *)&paVar8[2].parent == *(char *)&paVar10[2].parent);
                  auVar14[1] = -(*(char *)((long)&paVar8[2].parent + 1) ==
                                *(char *)((long)&paVar10[2].parent + 1));
                  auVar14[2] = -(*(char *)((long)&paVar8[2].parent + 2) ==
                                *(char *)((long)&paVar10[2].parent + 2));
                  auVar14[3] = -(*(char *)((long)&paVar8[2].parent + 3) ==
                                *(char *)((long)&paVar10[2].parent + 3));
                  auVar14[4] = -(*(char *)((long)&paVar8[2].parent + 4) ==
                                *(char *)((long)&paVar10[2].parent + 4));
                  auVar14[5] = -(*(char *)((long)&paVar8[2].parent + 5) ==
                                *(char *)((long)&paVar10[2].parent + 5));
                  auVar14[6] = -(*(char *)((long)&paVar8[2].parent + 6) ==
                                *(char *)((long)&paVar10[2].parent + 6));
                  auVar14[7] = -(*(char *)((long)&paVar8[2].parent + 7) ==
                                *(char *)((long)&paVar10[2].parent + 7));
                  auVar14[8] = -(*(char *)&paVar8[2].left == *(char *)&paVar10[2].left);
                  auVar14[9] = -(*(char *)((long)&paVar8[2].left + 1) ==
                                *(char *)((long)&paVar10[2].left + 1));
                  auVar14[10] = -(*(char *)((long)&paVar8[2].left + 2) ==
                                 *(char *)((long)&paVar10[2].left + 2));
                  auVar14[0xb] = -(*(char *)((long)&paVar8[2].left + 3) ==
                                  *(char *)((long)&paVar10[2].left + 3));
                  auVar14[0xc] = -(*(char *)((long)&paVar8[2].left + 4) ==
                                  *(char *)((long)&paVar10[2].left + 4));
                  auVar14[0xd] = -(*(char *)((long)&paVar8[2].left + 5) ==
                                  *(char *)((long)&paVar10[2].left + 5));
                  auVar14[0xe] = -(*(char *)((long)&paVar8[2].left + 6) ==
                                  *(char *)((long)&paVar10[2].left + 6));
                  auVar14[0xf] = -(*(char *)((long)&paVar8[2].left + 7) ==
                                  *(char *)((long)&paVar10[2].left + 7));
                  paVar13 = paVar10[2].right;
                  paVar1 = paVar8[2].right;
                  auVar15[0] = -((char)paVar1 == (char)paVar13);
                  auVar15[1] = -((char)((ulong)paVar1 >> 8) == (char)((ulong)paVar13 >> 8));
                  auVar15[2] = -((char)((ulong)paVar1 >> 0x10) == (char)((ulong)paVar13 >> 0x10));
                  auVar15[3] = -((char)((ulong)paVar1 >> 0x18) == (char)((ulong)paVar13 >> 0x18));
                  auVar15[4] = -((char)((ulong)paVar1 >> 0x20) == (char)((ulong)paVar13 >> 0x20));
                  auVar15[5] = -((char)((ulong)paVar1 >> 0x28) == (char)((ulong)paVar13 >> 0x28));
                  auVar15[6] = -((char)((ulong)paVar1 >> 0x30) == (char)((ulong)paVar13 >> 0x30));
                  auVar15[7] = -((char)((ulong)paVar1 >> 0x38) == (char)((ulong)paVar13 >> 0x38));
                  auVar15[8] = 0xff;
                  auVar15[9] = 0xff;
                  auVar15[10] = 0xff;
                  auVar15[0xb] = 0xff;
                  auVar15[0xc] = 0xff;
                  auVar15[0xd] = 0xff;
                  auVar15[0xe] = 0xff;
                  auVar15[0xf] = 0xff;
                  auVar15 = auVar15 & auVar14;
                  if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff)
                  goto LAB_0012b1ca;
                }
                (*(code *)plVar12)(paVar8,log);
                paVar10 = paVar8;
              }
LAB_0012b1ca:
              paVar8 = (avl_node *)(paVar8->list).next;
            } while (paVar8 != (avl_node *)0x0);
          }
          paVar8 = avl_find(&db->schema->entries,&local_40);
          for (paVar6 = paVar8;
              ((paVar6 != (avl_node *)0x0 && (paVar6 != (avl_node *)&db->schema->entries)) &&
              ((paVar6 == paVar8 || (paVar6->follower == true))));
              paVar6 = (avl_node *)(paVar6->list).next) {
            if (paVar6[1].key != (void *)0x0) {
              if (paVar6 == paVar8) {
                abuf_puts(log,"    Description:\n");
              }
              cfg_append_printable_line(log,"        %s",paVar6[1].key);
            }
          }
          iVar3 = 0;
        }
        free(pcVar4);
        return iVar3;
      }
      plVar12 = (pcVar2->sections).list_head.next;
      if (plVar12->prev != (db->schema->sections).list_head.prev) {
        plVar11 = (list_entity *)0x0;
        do {
          if (plVar11 == (list_entity *)0x0) {
LAB_0012b0e9:
            _print_schema_section(log,db,(char *)plVar12[3].prev);
            plVar11 = plVar12[3].prev;
          }
          else {
            iVar3 = strcasecmp((char *)plVar12[3].prev,(char *)plVar11);
            if (iVar3 != 0) {
              abuf_puts(log,"\n");
              goto LAB_0012b0e9;
            }
          }
          plVar12 = plVar12->next;
        } while (plVar12->prev != (db->schema->sections).list_head.prev);
      }
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int
cfg_cmd_handle_schema(struct cfg_db *db, const char *arg, struct autobuf *log) {
  struct cfg_schema_section *s_section;
  char *copy, *ptr;
  int result;

  if (db->schema == NULL) {
    abuf_puts(log, "Internal error, database not connected to schema\n");
    return -1;
  }

  if (arg == NULL || *arg == 0) {
    abuf_puts(log, "List of section types:\n"
                   "(use this command with the types as parameter for more information)\n");
    avl_for_each_element(&db->schema->sections, s_section, _section_node) {
      if (!s_section->_section_node.follower) {
        cfg_append_printable_line(log, CFG_HELP_INDENT_PREFIX "%s (%s)%s%s", s_section->type,
          CFG_SCHEMA_SECTIONMODE[s_section->mode], s_section->help ? ": " : "", s_section->help ? s_section->help : "");
      }
      else if (s_section->help) {
        cfg_append_printable_line(log, CFG_HELP_INDENT_PREFIX CFG_HELP_INDENT_PREFIX "%s", s_section->help);
      }
    }
    return 0;
  }

  if (strcmp(arg, "all") == 0) {
    const char *last_type = NULL;

    avl_for_each_element(&db->schema->sections, s_section, _section_node) {
      if (last_type == NULL || strcasecmp(s_section->type, last_type) != 0) {
        if (last_type != NULL) {
          abuf_puts(log, "\n");
        }
        _print_schema_section(log, db, s_section->type);
        last_type = s_section->type;
      }
    }
    return 0;
  }

  /* copy string into stack*/
  copy = strdup(arg);

  /* prepare for cleanup */
  result = -1;

  ptr = strchr(copy, '.');
  if (ptr) {
    *ptr++ = 0;
  }

  if (ptr == NULL) {
    result = _print_schema_section(log, db, copy);
  }
  else {
    result = _print_schema_entry(log, db, copy, ptr);
  }

  free(copy);
  return result;
}